

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O3

void dump_2D_fdtd(fdtd2D *fdtd,char *fileName,dumpable_data what_to_dump)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  FILE *__stream;
  ulong uVar3;
  void **ppvVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  undefined1 in_XMM3 [16];
  
  __stream = fopen(fileName,"w");
  if (what_to_dump - dump_ez < 6) {
    uVar3 = fdtd->sizeY;
    switch(what_to_dump) {
    case dump_ez:
      ppvVar4 = &fdtd->ez;
      break;
    case dump_hx:
      ppvVar4 = &fdtd->hx;
      break;
    case dump_hy:
      ppvVar4 = &fdtd->hy;
      break;
    case dump_hz:
      goto switchD_001043c6_caseD_5;
    case dump_permittivity:
      ppvVar4 = &fdtd->permittivity_inv;
      break;
    case dump_permeability:
      ppvVar4 = &fdtd->permeability_inv;
    }
    uVar7 = fdtd->sizeX;
    if (uVar7 != 0) {
      pvVar6 = *ppvVar4;
      lVar8 = uVar3 * 8;
      uVar5 = 0;
      do {
        if (1 < uVar3) {
          auVar1 = vcvtusi2sd_avx512f(in_XMM3,uVar5);
          uVar7 = 1;
          do {
            auVar2 = vcvtusi2sd_avx512f(in_XMM3,uVar7);
            fprintf(__stream,"%e %e %e\n",auVar1._0_8_ * fdtd->dx,auVar2._0_8_ * fdtd->dy,
                    *(undefined8 *)((long)pvVar6 + uVar7 * 8));
            uVar3 = fdtd->sizeY;
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar3);
          uVar7 = fdtd->sizeX;
        }
        uVar5 = uVar5 + 1;
        pvVar6 = (void *)((long)pvVar6 + lVar8);
      } while (uVar5 < uVar7);
    }
    fclose(__stream);
    return;
  }
switchD_001043c6_caseD_5:
  uVar3 = (ulong)what_to_dump;
  dump_2D_fdtd_cold_1();
  free(*(void **)(uVar3 + 0x18));
  free(*(void **)(uVar3 + 0x20));
  free(*(void **)(uVar3 + 0x28));
  free(*(void **)(uVar3 + 0x30));
  free(*(void **)(uVar3 + 0x38));
  free(*(void **)(uVar3 + 0xf0));
  free(*(void **)(uVar3 + 0xe8));
  free(*(void **)(uVar3 + 0x108));
  free(*(void **)(uVar3 + 0x100));
  free(*(void **)(uVar3 + 0x40));
  free(*(void **)(uVar3 + 0x48));
  free(*(void **)(uVar3 + 0x50));
  free(*(void **)(uVar3 + 0x58));
  lVar8 = 0;
  do {
    free(*(void **)(uVar3 + 0x60 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  free(*(void **)(uVar3 + 0x80));
  free(*(void **)(uVar3 + 0x90));
  return;
}

Assistant:

void dump_2D_fdtd(const struct fdtd2D *fdtd, const char *fileName,
                  enum dumpable_data what_to_dump) {
  FILE *out = fopen(fileName, "w");
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, data, fdtd->ez);
  switch (what_to_dump) {
  case dump_ez:
    break;
  case dump_hx:
    data = fdtd->hx;
    break;
  case dump_hy:
    data = fdtd->hy;
    break;
  case dump_permeability:
    data = fdtd->permeability_inv;
    break;
  case dump_permittivity:
    data = fdtd->permittivity_inv;
    break;
  default:
    fprintf(stderr, "Dump of \"%s\" not available for 2D fdtd\n",
            dumpable_data_name[what_to_dump]);
    exit(EXIT_FAILURE);
  }
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
    for (uintmax_t j = 1; j < fdtd->sizeY; ++j) {
      fprintf(out, "%e %e %e\n", (float_type)i * fdtd->dx,
              (float_type)j * fdtd->dy, data[i][j]);
    }
  }
  fclose(out);
}